

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecProtocol.cpp
# Opt level: O0

char * HdmiCec::GetFrameTypeString(FrameType type)

{
  char *pcStack_10;
  FrameType type_local;
  
  switch(type) {
  case FrameType_StartSeq:
    pcStack_10 = "StartSeq";
    break;
  case FrameType_Header:
    pcStack_10 = "Header";
    break;
  case FrameType_OpCode:
    pcStack_10 = "OpCode";
    break;
  case FrameType_Operand:
    pcStack_10 = "Operand";
    break;
  case FrameType_EOM:
    pcStack_10 = "EOM";
    break;
  case FrameType_ACK:
    pcStack_10 = "ACK";
    break;
  default:
    pcStack_10 = "Invalid";
  }
  return pcStack_10;
}

Assistant:

const char* GetFrameTypeString( FrameType type )
    {
        switch( type )
        {
        case FrameType_StartSeq:
            return "StartSeq";
        case FrameType_Header:
            return "Header";
        case FrameType_OpCode:
            return "OpCode";
        case FrameType_Operand:
            return "Operand";
        case FrameType_EOM:
            return "EOM";
        case FrameType_ACK:
            return "ACK";
        default:
            break;
        }
        return "Invalid";
    }